

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  FieldGenerator *pFVar5;
  Descriptor *pDVar6;
  int iVar7;
  int extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  long lVar8;
  cpp *field_00;
  long lVar9;
  int iVar10;
  ulong uVar11;
  string local_60;
  FieldGeneratorMap *local_40;
  MessageGenerator *local_38;
  
  io::Printer::Print(printer,"void $classname$::Clear() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  lVar8 = extraout_RDX;
  if (0 < *(int *)(this->descriptor_ + 0x58)) {
    io::Printer::Print(printer,"_extensions_.Clear();\n");
    lVar8 = extraout_RDX_00;
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x2c)) {
    local_40 = &this->field_generators_;
    iVar3 = -1;
    lVar9 = 0;
    uVar11 = 0;
    local_38 = this;
    do {
      iVar7 = (int)lVar8;
      lVar8 = *(long *)(pDVar6 + 0x30);
      if (*(int *)(lVar8 + 0x30 + lVar9) != 3) {
        iVar2 = iVar3 + 7;
        if (iVar3 >= 0) {
          iVar2 = iVar3;
        }
        iVar10 = (int)uVar11;
        if (iVar3 < 0) {
LAB_00196823:
          if (-1 < iVar3) {
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
            iVar7 = extraout_EDX;
          }
          if (*(char *)(lVar8 + 0x34 + lVar9) == '\0') {
            plVar4 = (long *)(*(long *)(lVar8 + 0x38 + lVar9) + 0x30);
          }
          else {
            lVar1 = *(long *)(lVar8 + 0x40 + lVar9);
            if (lVar1 == 0) {
              plVar4 = (long *)(*(long *)(lVar8 + 0x20 + lVar9) + 0x80);
            }
            else {
              plVar4 = (long *)(lVar1 + 0x70);
            }
          }
          SimpleItoa_abi_cxx11_
                    (&local_60,
                     (protobuf *)
                     (ulong)(uint)((int)((ulong)((lVar8 - *plVar4) + lVar9) >> 3) * -0x11111111),
                     iVar7);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n"
                             ,"index",&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          field = extraout_RDX_01;
        }
        else {
          field = (FieldDescriptor *)(uVar11 >> 3 & 0x1fffffff);
          iVar7 = (int)field;
          if (iVar7 != iVar2 >> 3) goto LAB_00196823;
        }
        field_00 = (cpp *)(lVar8 + lVar9);
        iVar7 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(uint *)(lVar8 + 0x2c + lVar9) * 4);
        iVar3 = iVar10;
        if (iVar7 - 9U < 2) {
          FieldName_abi_cxx11_(&local_60,field_00,field);
          io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar5 = FieldGeneratorMap::get(local_40,(FieldDescriptor *)field_00);
          (*pFVar5->_vptr_FieldGenerator[6])(pFVar5,printer);
          this = local_38;
          if (iVar7 - 9U < 2) {
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
          }
        }
        else {
          pFVar5 = FieldGeneratorMap::get(local_40,(FieldDescriptor *)field_00);
          (*pFVar5->_vptr_FieldGenerator[6])(pFVar5,printer);
        }
      }
      uVar11 = uVar11 + 1;
      pDVar6 = this->descriptor_;
      lVar8 = (long)*(int *)(pDVar6 + 0x2c);
      lVar9 = lVar9 + 0x78;
    } while ((long)uVar11 < lVar8);
    if (-1 < iVar3) {
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x2c)) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (*(int *)(*(long *)(pDVar6 + 0x30) + 0x30 + lVar8) == 3) {
        pFVar5 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar8));
        (*pFVar5->_vptr_FieldGenerator[6])(pFVar5,printer);
      }
      lVar9 = lVar9 + 1;
      pDVar6 = this->descriptor_;
      lVar8 = lVar8 + 0x78;
    } while (lVar9 < *(int *)(pDVar6 + 0x2c));
  }
  io::Printer::Print(printer,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"mutable_unknown_fields()->Clear();\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print("void $classname$::Clear() {\n",
                 "classname", classname_);
  printer->Indent();

  int last_index = -1;

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // We can use the fact that _has_bits_ is a giant bitfield to our
      // advantage:  We can check up to 32 bits at a time for equality to
      // zero, and skip the whole range if so.  This can improve the speed
      // of Clear() for messages which contain a very large number of
      // optional fields of which only a few are used at a time.  Here,
      // we've chosen to check 8 bits at a time rather than 32.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      // It's faster to just overwrite primitive types, but we should
      // only clear strings and messages if they were set.
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool should_check_bit =
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

      if (should_check_bit) {
        printer->Print(
          "if (has_$name$()) {\n",
          "name", FieldName(field));
        printer->Indent();
      }

      field_generators_.get(field).GenerateClearingCode(printer);

      if (should_check_bit) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we clear them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateClearingCode(printer);
    }
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}